

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1eec638::SatdLpTest_DISABLED_Speed_Test::TestBody
          (SatdLpTest_DISABLED_Speed_Test *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  pointer *__ptr;
  int iVar4;
  SEARCH_METHODS *message;
  aom_usec_timer c_timer_;
  aom_usec_timer simd_timer_;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AssertHelper local_80;
  int local_74;
  internal local_70 [8];
  undefined8 *local_68;
  int local_5c;
  timeval local_58;
  timeval local_48;
  timeval local_38;
  timeval local_28;
  
  SatdTestBase<short,_int_(*)(const_short_*,_int)>::FillRandom
            ((SatdTestBase<short,_int_(*)(const_short_*,_int)> *)this);
  iVar4 = 500000;
  printf("size = %d number of iteration is %d \n",
         (ulong)(uint)(this->super_SatdLpTest).
                      super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_,500000);
  gettimeofday(&local_58,(__timezone_ptr_t)0x0);
  do {
    local_74 = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
                 satd_func_ref_)((this->super_SatdLpTest).
                                 super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                                 (this->super_SatdLpTest).
                                 super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  iVar4 = 500000;
  do {
    local_5c = (*(this->super_SatdLpTest).super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.
                 satd_func_simd_)((this->super_SatdLpTest).
                                  super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.src_,
                                  (this->super_SatdLpTest).
                                  super_SatdTestBase<short,_int_(*)(const_short_*,_int)>.satd_size_)
    ;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar2 = local_48.tv_usec - local_58.tv_usec;
  iVar4 = (int)lVar2 + 1000000;
  if (-1 < lVar2) {
    iVar4 = (int)lVar2;
  }
  lVar1 = local_28.tv_usec - local_38.tv_usec;
  iVar3 = (int)lVar1 + 1000000;
  if (-1 < lVar1) {
    iVar3 = (int)lVar1;
  }
  printf("c_time = %d \t simd_time = %d \t Gain = %4.2f \n",
         (double)((float)(iVar4 + ((int)(lVar2 >> 0x3f) +
                                  ((int)local_48.tv_sec - (int)local_58.tv_sec)) * 1000000) /
                 (float)(iVar3 + ((int)(lVar1 >> 0x3f) +
                                 ((int)local_28.tv_sec - (int)local_38.tv_sec)) * 1000000)));
  testing::internal::CmpHelperEQ<int,int>(local_70,"total_ref","total_simd",&local_74,&local_5c);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_88._M_head_impl + 0x10),"Output mismatch \n",0x11);
    if (local_68 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/avg_test.cc"
               ,0x3b6,(char *)message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_68 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_68 != local_68 + 2) {
      operator_delete((undefined8 *)*local_68);
    }
    operator_delete(local_68);
  }
  return;
}

Assistant:

TEST_P(SatdLpTest, DISABLED_Speed) {
  FillRandom();
  RunSpeedTest();
}